

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

QString * funcSig(QString *__return_storage_ptr__,Command *c,char *className)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char16_t *pcVar5;
  char *pcVar6;
  char16_t *pcVar7;
  TypedName *a;
  TypedName *this;
  long in_FS_OFFSET;
  bool bVar8;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QString::toLocal8Bit((QByteArray *)&local_50,&(c->cmd).type);
  pcVar7 = local_50.ptr;
  if (local_50.ptr == (char16_t *)0x0) {
    pcVar7 = (char16_t *)&QByteArray::_empty;
  }
  bVar8 = className == (char *)0x0;
  if (bVar8) {
    className = "";
  }
  pcVar4 = "::";
  if (bVar8) {
    pcVar4 = "";
  }
  QString::toLocal8Bit((QByteArray *)&local_68,(QString *)c);
  pcVar5 = local_68.ptr;
  if (local_68.ptr == (char16_t *)0x0) {
    pcVar5 = (char16_t *)&QByteArray::_empty;
  }
  QString::asprintf((char *)__return_storage_ptr__,"%s %s%s%s",pcVar7,className,pcVar4,pcVar5);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_50);
  if ((c->args).d.size != 0) {
    QString::append((QChar)(char16_t)__return_storage_ptr__);
    this = (c->args).d.ptr;
    bVar8 = true;
    for (lVar2 = (c->args).d.size * 0x48; lVar2 != 0; lVar2 = lVar2 + -0x48) {
      if (!bVar8) {
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        local_50.d = (Data *)0x0;
        local_50.ptr = L", ";
        local_68.size = 0;
        local_50.size = 2;
        QString::append(__return_storage_ptr__);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      }
      QString::toLocal8Bit((QByteArray *)&local_68,&this->type);
      pcVar7 = local_68.ptr;
      if (local_68.ptr == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QByteArray::_empty;
      }
      cVar1 = QString::endsWith((QChar)(char16_t)&this->type,0x2a);
      pcVar4 = " ";
      if (cVar1 != '\0') {
        pcVar4 = "";
      }
      QString::toLocal8Bit((QByteArray *)&local_80,&this->name);
      pcVar3 = local_80.ptr;
      if (local_80.ptr == (char *)0x0) {
        pcVar3 = (char *)&QByteArray::_empty;
      }
      QString::toLocal8Bit((QByteArray *)&local_98,&this->typeSuffix);
      pcVar6 = local_98.ptr;
      if (local_98.ptr == (char *)0x0) {
        pcVar6 = (char *)&QByteArray::_empty;
      }
      bVar8 = false;
      QString::asprintf((char *)&local_50,"%s%s%s%s",pcVar7,pcVar4,pcVar3,pcVar6);
      QString::append(__return_storage_ptr__);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
      this = this + 1;
    }
    QString::append((QChar)(char16_t)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString funcSig(const VkSpecParser::Command &c, const char *className = nullptr)
{
    QString s(QString::asprintf("%s %s%s%s", qPrintable(c.cmd.type),
                                (className ? className : ""), (className ? "::" : ""),
                                qPrintable(c.cmd.name)));
    if (!c.args.isEmpty()) {
        s += u'(';
        bool first = true;
        for (const VkSpecParser::TypedName &a : c.args) {
            if (!first)
                s += QStringLiteral(", ");
            else
                first = false;
            s += QString::asprintf("%s%s%s%s", qPrintable(a.type),
                                   (a.type.endsWith(u'*') ? "" : " "),
                                   qPrintable(a.name), qPrintable(a.typeSuffix));
        }
        s += u')';
    }
    return s;
}